

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

int bcf_hdr_set(bcf_hdr_t *hdr,char *fname)

{
  bcf_hrec_t *hrec_00;
  bcf_hrec_t *hrec;
  char **ppcStack_30;
  int k;
  char **lines;
  int n;
  int i;
  char *fname_local;
  bcf_hdr_t *hdr_local;
  
  _n = fname;
  fname_local = (char *)hdr;
  ppcStack_30 = hts_readlines(fname,(int *)&lines);
  if (ppcStack_30 == (char **)0x0) {
    hdr_local._4_4_ = 1;
  }
  else {
    for (lines._4_4_ = 0; lines._4_4_ < (int)lines + -1; lines._4_4_ = lines._4_4_ + 1) {
      hrec_00 = bcf_hdr_parse_line((bcf_hdr_t *)fname_local,ppcStack_30[lines._4_4_],
                                   (int *)((long)&hrec + 4));
      if (hrec_00 != (bcf_hrec_t *)0x0) {
        bcf_hdr_add_hrec((bcf_hdr_t *)fname_local,hrec_00);
      }
      free(ppcStack_30[lines._4_4_]);
    }
    bcf_hdr_parse_sample_line((bcf_hdr_t *)fname_local,ppcStack_30[(int)lines + -1]);
    free(ppcStack_30[(int)lines + -1]);
    free(ppcStack_30);
    bcf_hdr_sync((bcf_hdr_t *)fname_local);
    hdr_local._4_4_ = 0;
  }
  return hdr_local._4_4_;
}

Assistant:

int bcf_hdr_set(bcf_hdr_t *hdr, const char *fname)
{
    int i, n;
    char **lines = hts_readlines(fname, &n);
    if ( !lines ) return 1;
    for (i=0; i<n-1; i++)
    {
        int k;
        bcf_hrec_t *hrec = bcf_hdr_parse_line(hdr,lines[i],&k);
        if ( hrec ) bcf_hdr_add_hrec(hdr, hrec);
        free(lines[i]);
    }
    bcf_hdr_parse_sample_line(hdr,lines[n-1]);
    free(lines[n-1]);
    free(lines);
    bcf_hdr_sync(hdr);
    return 0;
}